

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_goiftrue(FuncState *fs,expdesc *e)

{
  expkind eVar1;
  int iVar2;
  uint *puVar3;
  
  luaK_dischargevars(fs,e);
  eVar1 = e->k;
  iVar2 = -1;
  if ((2 < eVar1 - VK) && (eVar1 != VTRUE)) {
    if (eVar1 == VJMP) {
      puVar3 = fs->f->code + (e->u).info;
      if ((0 < (long)(e->u).info) && ((char)luaP_opmodes[puVar3[-1] & 0x3f] < '\0')) {
        puVar3 = puVar3 + -1;
      }
      *puVar3 = (uint)((*puVar3 & 0x3fc0) == 0) << 6 | *puVar3 & 0xffffc03f;
      iVar2 = (e->u).info;
    }
    else {
      iVar2 = jumponcond(fs,e,0);
    }
  }
  luaK_concat(fs,&e->f,iVar2);
  iVar2 = e->t;
  fs->lasttarget = fs->pc;
  luaK_concat(fs,&fs->jpc,iVar2);
  e->t = -1;
  return;
}

Assistant:

void luaK_goiftrue(FuncState *fs, expdesc *e) {
    int pc;  /* pc of new jump */
    luaK_dischargevars(fs, e);
    switch (e->k) {
        case VJMP: {  /* condition? */
            negatecondition(fs, e);  /* jump when it is false */
            pc = e->u.info;  /* save jump position */
            break;
        }
        case VK:
        case VKFLT:
        case VKINT:
        case VTRUE: {
            pc = NO_JUMP;  /* always true; do nothing */
            break;
        }
        default: {
            pc = jumponcond(fs, e, 0);  /* jump when false */
            break;
        }
    }
    luaK_concat(fs, &e->f, pc);  /* insert new jump in false list */
    luaK_patchtohere(fs, e->t);  /* true list jumps to here (to go through) */
    e->t = NO_JUMP;
}